

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

uint32_t helper_bcdus_ppc(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,uint32_t ps)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  _Bool local_4d;
  int invalid;
  uint64_t local_48;
  uint64_t auStack_40 [2];
  
  invalid = 0;
  local_4d = false;
  local_48 = b->u64[0];
  auStack_40[0] = b->u64[1];
  iVar3 = 0;
  while (iVar3 != 0x20) {
    bcd_get_digit(b,iVar3,&invalid);
    iVar3 = iVar3 + 1;
    if (invalid != 0) {
      return 1;
    }
  }
  cVar1 = a->s8[8];
  iVar3 = (int)cVar1;
  if (iVar3 < 0x20) {
    if (cVar1 < -0x1f) {
      local_48 = 0;
      auStack_40[0] = 0;
    }
    else {
      if ('\0' < cVar1) {
        ulshift(&local_48,auStack_40,iVar3 << 2,&local_4d);
        uVar4 = (uint)local_4d;
        goto LAB_00955a30;
      }
      urshift(&local_48,auStack_40,iVar3 * -4);
    }
    uVar4 = 0;
  }
  else {
    local_48 = 0;
    auStack_40[0] = 0;
    uVar4 = 1;
  }
LAB_00955a30:
  r->u64[0] = local_48;
  r->u64[1] = auStack_40[0];
  uVar2 = bcd_cmp_zero(r);
  return uVar2 | uVar4;
}

Assistant:

uint32_t helper_bcdus(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b, uint32_t ps)
{
    int cr;
    int i;
    int invalid = 0;
    bool ox_flag = false;
    ppc_avr_t ret = *b;

    for (i = 0; i < 32; i++) {
        bcd_get_digit(b, i, &invalid);

        if (unlikely(invalid)) {
            return CRF_SO;
        }
    }

    i = a->VsrSB(7);
    if (i >= 32) {
        ox_flag = true;
        ret.VsrD(1) = ret.VsrD(0) = 0;
    } else if (i <= -32) {
        ret.VsrD(1) = ret.VsrD(0) = 0;
    } else if (i > 0) {
        ulshift(&ret.VsrD(1), &ret.VsrD(0), i * 4, &ox_flag);
    } else {
        urshift(&ret.VsrD(1), &ret.VsrD(0), -i * 4);
    }
    *r = ret;

    cr = bcd_cmp_zero(r);
    if (ox_flag) {
        cr |= CRF_SO;
    }

    return cr;
}